

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_phi2::llm_build_phi2
          (llm_build_phi2 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *this_00;
  pointer plVar2;
  ggml_context *pgVar3;
  uint32_t uVar4;
  ggml_tensor *pgVar5;
  llm_graph_input_attn_kv_unified *inp;
  ulong uVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  undefined8 uVar9;
  ggml_tensor *pgVar10;
  undefined8 uVar11;
  long lVar12;
  int il;
  int il_00;
  long lVar13;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar14;
  ggml_tensor *local_70;
  ggml_tensor *local_68;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  this_00 = (this->super_llm_graph_context).hparams;
  uVar1 = this_00->n_embd_head_v;
  uVar4 = llama_hparams::n_embd_v_gqa(this_00,0);
  if (uVar1 != ((this->super_llm_graph_context).hparams)->n_embd_head_k) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1b54,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_70 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar5 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  uVar6 = (ulong)uVar4;
  lVar12 = 0;
  for (lVar13 = 0; uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20),
      lVar13 < (this->super_llm_graph_context).n_layer; lVar13 = lVar13 + 1) {
    plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    il_00 = (int)lVar13;
    local_68 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_70,
                          *(ggml_tensor **)((long)&plVar2->attn_norm + lVar12),
                          *(ggml_tensor **)((long)&plVar2->attn_norm_b + lVar12),LLM_NORM,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,local_68,"attn_norm",il_00);
    plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    pgVar7 = *(ggml_tensor **)((long)&plVar2->wqkv + lVar12);
    if (pgVar7 == (ggml_tensor *)0x0) {
      pgVar3 = (this->super_llm_graph_context).ctx0;
      pgVar7 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)((long)&plVar2->wq + lVar12),local_68);
      pgVar7 = (ggml_tensor *)
               ggml_add(pgVar3,pgVar7,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->bq + lVar12));
      pgVar3 = (this->super_llm_graph_context).ctx0;
      pgVar10 = llm_graph_context::build_lora_mm
                          (&this->super_llm_graph_context,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->wk + lVar12),
                           local_68);
      pgVar10 = (ggml_tensor *)
                ggml_add(pgVar3,pgVar10,
                         *(undefined8 *)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->bk + lVar12));
      pgVar3 = (this->super_llm_graph_context).ctx0;
      pgVar8 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wv + lVar12),local_68
                         );
      pgVar8 = (ggml_tensor *)
               ggml_add(pgVar3,pgVar8,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->bv + lVar12));
    }
    else {
      pgVar7 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,pgVar7,local_68);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"wqkv",il_00);
      pgVar8 = (ggml_tensor *)
               ggml_add((this->super_llm_graph_context).ctx0,pgVar7,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->bqkv + lVar12));
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"bqkv",il_00);
      pgVar3 = (this->super_llm_graph_context).ctx0;
      uVar9 = ggml_view_2d(pgVar3,pgVar8,(this->super_llm_graph_context).n_embd,
                           (long)(this->super_llm_graph_context).n_tokens,pgVar8->nb[1],0);
      pgVar7 = (ggml_tensor *)ggml_cont(pgVar3,uVar9);
      pgVar3 = (this->super_llm_graph_context).ctx0;
      uVar9 = ggml_view_2d(pgVar3,pgVar8,uVar6,(long)(this->super_llm_graph_context).n_tokens,
                           pgVar8->nb[1],(this->super_llm_graph_context).n_embd << 2);
      pgVar10 = (ggml_tensor *)ggml_cont(pgVar3,uVar9);
      pgVar3 = (this->super_llm_graph_context).ctx0;
      uVar9 = ggml_view_2d(pgVar3,pgVar8,uVar6,(long)(this->super_llm_graph_context).n_tokens,
                           pgVar8->nb[1],((this->super_llm_graph_context).n_embd + uVar6) * 4);
      pgVar8 = (ggml_tensor *)ggml_cont(pgVar3,uVar9);
    }
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"Kcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Vcur",il_00);
    uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar7,uVar1,
                            (this->super_llm_graph_context).n_head,
                            (long)(this->super_llm_graph_context).n_tokens);
    uVar11 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar10,uVar1,
                             (this->super_llm_graph_context).n_head_kv,
                             (long)(this->super_llm_graph_context).n_tokens);
    pgVar7 = (ggml_tensor *)
             ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,uVar1,
                             (this->super_llm_graph_context).n_head_kv,
                             (long)(this->super_llm_graph_context).n_tokens);
    pgVar10 = (ggml_tensor *)
              ggml_rope_ext((this->super_llm_graph_context).freq_base,
                            (this->super_llm_graph_context).freq_scale,
                            (this->super_llm_graph_context).ext_factor,
                            (this->super_llm_graph_context).attn_factor,
                            (this->super_llm_graph_context).beta_fast,
                            (this->super_llm_graph_context).beta_slow,
                            (this->super_llm_graph_context).ctx0,uVar9,pgVar5,0,
                            (int)(this->super_llm_graph_context).n_rot,
                            (this->super_llm_graph_context).rope_type,
                            CONCAT44(uVar14,(this->super_llm_graph_context).n_ctx_orig));
    pgVar8 = (ggml_tensor *)
             ggml_rope_ext((this->super_llm_graph_context).freq_base,
                           (this->super_llm_graph_context).freq_scale,
                           (this->super_llm_graph_context).ext_factor,
                           (this->super_llm_graph_context).attn_factor,
                           (this->super_llm_graph_context).beta_fast,
                           (this->super_llm_graph_context).beta_slow,
                           (this->super_llm_graph_context).ctx0,uVar11,pgVar5,0,
                           (int)(this->super_llm_graph_context).n_rot,
                           (this->super_llm_graph_context).rope_type,
                           (this->super_llm_graph_context).n_ctx_orig);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"Qcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Vcur",il_00);
    pgVar10 = (ggml_tensor *)
              ggml_scale(1.0 / SQRT((float)uVar1),(this->super_llm_graph_context).ctx0,pgVar10);
    plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    pgVar7 = llm_graph_context::build_attn
                       (&this->super_llm_graph_context,inp,gf,
                        *(ggml_tensor **)((long)&plVar2->wo + lVar12),
                        *(ggml_tensor **)((long)&plVar2->bo + lVar12),pgVar10,pgVar8,pgVar7,
                        (ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0,il_00);
    if (lVar13 == (this->super_llm_graph_context).n_layer + -1) {
      pgVar10 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
      pgVar7 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar7,pgVar10);
      local_70 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,local_70,pgVar10)
      ;
      local_68 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,local_68,pgVar10)
      ;
    }
    plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    in_stack_ffffffffffffff38 = 0;
    pgVar10 = llm_graph_context::build_ffn
                        (&this->super_llm_graph_context,local_68,
                         *(ggml_tensor **)((long)&plVar2->ffn_up + lVar12),
                         *(ggml_tensor **)((long)&plVar2->ffn_up_b + lVar12),(ggml_tensor *)0x0,
                         (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                         *(ggml_tensor **)((long)&plVar2->ffn_down + lVar12),
                         *(ggml_tensor **)((long)&plVar2->ffn_down_b + lVar12),(ggml_tensor *)0x0,
                         (ggml_tensor *)0x0,LLM_FFN_GELU,LLM_FFN_SEQ,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"ffn_out",il_00);
    uVar9 = ggml_add((this->super_llm_graph_context).ctx0,pgVar7,pgVar10);
    pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,uVar9,local_70);
    local_70 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar7,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,local_70,"l_out",il_00);
    lVar12 = lVar12 + 0x4f0;
  }
  pgVar5 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_70,model->output_norm,
                      model->output_norm_b,LLM_NORM,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar5;
  pgVar5 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar5);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_output_no_bias",-1);
  pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5,model->output_b);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar5;
  ggml_build_forward_expand(gf,pgVar5);
  return;
}

Assistant:

llm_build_phi2(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * attn_norm_output;
        ggml_tensor * ffn_output;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            attn_norm_output = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(attn_norm_output, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = nullptr;
                ggml_tensor * Kcur = nullptr;
                ggml_tensor * Vcur = nullptr;

                if (model.layers[il].wqkv) {
                    cur = build_lora_mm(model.layers[il].wqkv, attn_norm_output);
                    cb(cur, "wqkv", il);

                    cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                    cb(cur, "bqkv", il);

                    Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                    Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                    Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));
                } else {
                    Qcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wq, attn_norm_output), model.layers[il].bq);
                    Kcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wk, attn_norm_output), model.layers[il].bk);
                    Vcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wv, attn_norm_output), model.layers[il].bv);
                }

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                // with phi2, we scale the Q to avoid precision issues
                // ref: https://github.com/ml-explore/mlx-examples/blob/08e862336ade809bc37d1035f94b359e7d1a5152/phi2/phi2.py#L64-L66
                Qcur = ggml_scale(ctx0, Qcur, 1.0f/sqrtf(float(n_embd_head)));

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur              = ggml_get_rows(ctx0,              cur, inp_out_ids);
                inpL             = ggml_get_rows(ctx0,             inpL, inp_out_ids);
                attn_norm_output = ggml_get_rows(ctx0, attn_norm_output, inp_out_ids);
            }

            // FF
            {
                ffn_output = build_ffn(attn_norm_output,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        NULL,                      NULL,                        NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_SEQ, il);
                cb(ffn_output, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_output);
            cur = ggml_add(ctx0, cur, inpL);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = build_norm(inpL,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);
        cb(cur, "result_output_no_bias", -1);

        cur = ggml_add(ctx0, cur, model.output_b);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }